

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_openelm::llm_build_openelm
          (llm_build_openelm *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  undefined8 uVar2;
  int64_t *piVar3;
  uint32_t uVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  ggml_tensor *pgVar8;
  long lVar9;
  undefined8 uVar10;
  ggml_tensor *name;
  ggml_tensor *pgVar11;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar12;
  const_reference pvVar13;
  ggml_tensor *pgVar14;
  pointer plVar15;
  size_t in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *residual;
  int64_t n_head_qkv;
  int64_t n_head_kv;
  int64_t n_head;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd88;
  uint32_t il_00;
  int iVar16;
  int il_01;
  llama_hparams *in_stack_fffffffffffffd90;
  ggml_backend_buffer *pgVar17;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffda8;
  undefined4 uVar18;
  ggml_tensor *cur_01;
  llm_graph_context *in_stack_fffffffffffffdb0;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffde8;
  llm_graph_context *in_stack_fffffffffffffdf0;
  ggml_tensor *pgVar19;
  ggml_tensor *pgVar20;
  ggml_tensor *in_stack_fffffffffffffe28;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe48;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe58;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  size_t sVar21;
  ggml_tensor *in_stack_fffffffffffffe98;
  llm_graph_context *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_ffffffffffffff58;
  ggml_tensor *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar22;
  ggml_tensor *local_48;
  ggml_tensor *local_40;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffda0,
             (llm_graph_params *)in_stack_fffffffffffffd98);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  if (uVar1 != *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x24f4,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  local_48 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  pgVar5 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffdf0);
  pgVar6 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffe30);
  for (iVar22 = 0; il_00 = (uint32_t)((ulong)in_stack_fffffffffffffd88 >> 0x20),
      (long)iVar22 < *(long *)(in_RDI + 0x28); iVar22 = iVar22 + 1) {
    uVar4 = llama_hparams::n_head(in_stack_fffffffffffffd90,il_00);
    pgVar14 = (ggml_tensor *)(ulong)uVar4;
    uVar4 = llama_hparams::n_head_kv(in_stack_fffffffffffffd90,il_00);
    pgVar7 = (ggml_tensor *)(ulong)uVar4;
    lVar9 = (long)pgVar7 * 2;
    piVar3 = pgVar14->ne;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar22);
    llm_graph_context::build_norm
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd98,(llm_norm_type)((ulong)in_stack_fffffffffffffd90 >> 0x20),
               (int)in_stack_fffffffffffffd90);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               &in_stack_fffffffffffffd90->vocab_only,il_00);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar22);
    pgVar8 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               &in_stack_fffffffffffffd90->vocab_only,il_00);
    lVar9 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar8,*(undefined8 *)(in_RDI + 0x58),
                            (long)piVar3 + lVar9 + -0x10,(long)*(int *)(in_RDI + 0xa8));
    uVar2 = *(undefined8 *)(in_RDI + 0xc0);
    iVar16 = (int)((ulong)*(undefined8 *)(lVar9 + 0x40) >> 0x20);
    pgVar17 = (ggml_backend_buffer *)0x0;
    uVar10 = ggml_view_3d(uVar2,lVar9,uVar1,pgVar14,(long)*(int *)(in_RDI + 0xa8),
                          *(undefined8 *)(lVar9 + 0x38));
    ggml_cont(uVar2,uVar10);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)pgVar17,iVar16);
    uVar2 = *(undefined8 *)(in_RDI + 0xc0);
    iVar16 = (int)((ulong)*(undefined8 *)(lVar9 + 0x40) >> 0x20);
    pgVar17 = (ggml_backend_buffer *)(*(long *)(lVar9 + 0x38) * (long)pgVar14);
    uVar10 = ggml_view_3d(uVar2,lVar9,uVar1,pgVar7,(long)*(int *)(in_RDI + 0xa8));
    ggml_cont(uVar2,uVar10);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)pgVar17,iVar16);
    uVar2 = *(undefined8 *)(in_RDI + 0xc0);
    iVar16 = (int)((ulong)*(undefined8 *)(lVar9 + 0x40) >> 0x20);
    pgVar17 = (ggml_backend_buffer *)
              (*(long *)(lVar9 + 0x38) * ((long)pgVar7->ne + (long)(pgVar14->ne + -4)));
    uVar10 = ggml_view_3d(uVar2,lVar9,uVar1,pgVar7,(long)*(int *)(in_RDI + 0xa8));
    name = (ggml_tensor *)ggml_cont(uVar2,uVar10);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)pgVar17,iVar16);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar22);
    pgVar8 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                        in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (llm_norm_type)((ulong)pgVar17 >> 0x20),(int)pgVar17);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)pgVar17,iVar16);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar22);
    pgVar11 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                         in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         (llm_norm_type)((ulong)pgVar17 >> 0x20),(int)pgVar17);
    uVar18 = (undefined4)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)pgVar17,iVar16);
    inp = (llm_graph_input_attn_kv_unified *)
          ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                        *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                        *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                        *(undefined8 *)(in_RDI + 0xc0),pgVar8,pgVar5,0,
                        *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    pgVar12 = (ggml_tensor *)
              ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                            *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                            *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                            *(undefined8 *)(in_RDI + 0xc0),pgVar11,pgVar5,0,
                            *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)pgVar17,iVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)pgVar17,iVar16);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)pgVar17,iVar16);
    sVar21 = in_RCX;
    pgVar20 = pgVar6;
    pvVar13 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)iVar22);
    type_gate = (llm_ffn_gate_type)sVar21;
    type_op = (llm_ffn_op_type)pgVar6;
    iVar16 = (int)pvVar13->wo;
    pgVar6 = name;
    pgVar19 = pgVar12;
    sqrtf((float)uVar1);
    cur_01 = (ggml_tensor *)CONCAT44(uVar18,iVar22);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar8 = name;
    pgVar11 = pgVar12;
    local_40 = llm_graph_context::build_attn
                         ((llm_graph_context *)local_48,inp,(ggml_cgraph *)pgVar19,pgVar6,
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,pgVar7,pgVar14,
                          (ggml_tensor *)CONCAT44(iVar22,in_stack_ffffffffffffffa0),pgVar20,
                          (float)((ulong)in_RDI >> 0x20),(int)pgVar5);
    il_01 = (int)((ulong)pgVar12 >> 0x20);
    pgVar6 = pgVar20;
    if ((long)iVar22 == *(long *)(in_RDI + 0x28) + -1) {
      in_stack_fffffffffffffe58 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffde0);
      in_stack_ffffffffffffff60 = in_stack_fffffffffffffe58;
      in_stack_fffffffffffffe50 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_48,in_stack_fffffffffffffe58);
      local_48 = in_stack_fffffffffffffe50;
      in_stack_fffffffffffffe48 =
           (ggml_tensor *)
           ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_40,in_stack_ffffffffffffff60);
      pgVar6 = pgVar20;
      local_40 = in_stack_fffffffffffffe48;
    }
    pgVar12 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_48,local_40);
    pgVar7 = pgVar12;
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_01);
    in_stack_ffffffffffffff58 = pgVar7;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar22);
    pgVar14 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffdb0,cur_01,mw,cur_00,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_01);
    pvVar13 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)iVar22);
    pgVar19 = pvVar13->ffn_up;
    pvVar13 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)iVar22);
    pgVar20 = pvVar13->ffn_gate;
    pvVar13 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                         (long)iVar22);
    in_stack_fffffffffffffd98 = pvVar13->ffn_down;
    in_stack_fffffffffffffdb0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffda8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffda0 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd90 = (llama_hparams *)0x0;
    in_stack_fffffffffffffd88 = (ggml_tensor *)0x0;
    pgVar8 = llm_graph_context::build_ffn
                       ((llm_graph_context *)pgVar7,in_stack_fffffffffffffe28,
                        (ggml_tensor *)&stack0xfffffffffffffd88,pgVar20,pgVar19,pgVar14,pgVar12,
                        in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe58,pgVar8,pgVar11,type_op,type_gate,iVar16);
    in_stack_fffffffffffffe28 = pgVar8;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               &in_stack_fffffffffffffd90->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar8,in_stack_ffffffffffffff58);
    local_48 = llm_graph_context::build_cvec
                         ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,0
                         );
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               &in_stack_fffffffffffffd90->vocab_only,
               (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  }
  pgVar5 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                      in_stack_fffffffffffffd98,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                      (int)in_stack_fffffffffffffd90);
  pgVar6 = pgVar5;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             &in_stack_fffffffffffffd90->vocab_only,il_00);
  plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e89b6);
  plVar15->t_embd = pgVar5;
  pgVar6 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)pgVar6,in_stack_fffffffffffffde8,pgVar5);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             &in_stack_fffffffffffffd90->vocab_only,il_00);
  plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e8a3b);
  plVar15->t_logits = pgVar6;
  ggml_build_forward_expand(in_RCX,pgVar6);
  return;
}

Assistant:

llm_build_openelm(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;
        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            const int64_t n_head    = hparams.n_head(il);
            const int64_t n_head_kv = hparams.n_head_kv(il);
            const int64_t n_head_qkv = 2*n_head_kv + n_head;

            cur = inpL;
            ggml_tensor * residual = cur;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_reshape_3d(ctx0, cur, n_embd_head_k, n_head_qkv, n_tokens);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_3d(ctx0, cur, n_embd_head, n_head,    n_tokens, cur->nb[1], cur->nb[2], 0));
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_3d(ctx0, cur, n_embd_head, n_head_kv, n_tokens, cur->nb[1], cur->nb[2], cur->nb[1]*n_head));
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_3d(ctx0, cur, n_embd_head, n_head_kv, n_tokens, cur->nb[1], cur->nb[2], cur->nb[1]*(n_head+n_head_kv)));
                cb(Vcur, "Vcur", il);

                Qcur = build_norm(Qcur,
                        model.layers[il].attn_q_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(Qcur, "Qcur", il);

                Kcur = build_norm(Kcur,
                        model.layers[il].attn_k_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(Kcur, "Kcur", il);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, NULL,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, NULL,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Qcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                residual = ggml_get_rows(ctx0, residual, inp_out_ids);
                cur = ggml_get_rows(ctx0, cur, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, residual, cur);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            inpL = cur;
        }

        cur = inpL;

        // norm
        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }